

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::invalidateFramebuffer
          (ReferenceContext *this,deUint32 target,int numAttachments,deUint32 *attachments)

{
  MultisampleConstPixelBufferAccess stencilBuf;
  MultisampleConstPixelBufferAccess depthBuf;
  MultisamplePixelBufferAccess local_80;
  MultisampleConstPixelBufferAccess colorBuf0;
  
  getDrawColorbuffer((MultisamplePixelBufferAccess *)&depthBuf,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&colorBuf0,(MultisamplePixelBufferAccess *)&depthBuf);
  getDrawDepthbuffer((MultisamplePixelBufferAccess *)&stencilBuf,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&depthBuf,(MultisamplePixelBufferAccess *)&stencilBuf);
  getDrawStencilbuffer(&local_80,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&stencilBuf,&local_80);
  if (depthBuf.m_access.m_size.m_data[1] < colorBuf0.m_access.m_size.m_data[1]) {
    depthBuf.m_access.m_size.m_data[1] = colorBuf0.m_access.m_size.m_data[1];
  }
  if (depthBuf.m_access.m_size.m_data[1] <= stencilBuf.m_access.m_size.m_data[1]) {
    depthBuf.m_access.m_size.m_data[1] = stencilBuf.m_access.m_size.m_data[1];
  }
  if (depthBuf.m_access.m_size.m_data[1] < 1) {
    depthBuf.m_access.m_size.m_data[1] = 0;
  }
  if (depthBuf.m_access.m_size.m_data[2] < colorBuf0.m_access.m_size.m_data[2]) {
    depthBuf.m_access.m_size.m_data[2] = colorBuf0.m_access.m_size.m_data[2];
  }
  if (depthBuf.m_access.m_size.m_data[2] <= stencilBuf.m_access.m_size.m_data[2]) {
    depthBuf.m_access.m_size.m_data[2] = stencilBuf.m_access.m_size.m_data[2];
  }
  if (depthBuf.m_access.m_size.m_data[2] < 1) {
    depthBuf.m_access.m_size.m_data[2] = 0;
  }
  (*(this->super_Context)._vptr_Context[0x49])
            (this,(ulong)target,(ulong)(uint)numAttachments,attachments,0,0,
             (ulong)(uint)depthBuf.m_access.m_size.m_data[1],
             (ulong)(uint)depthBuf.m_access.m_size.m_data[2]);
  return;
}

Assistant:

void ReferenceContext::invalidateFramebuffer (deUint32 target, int numAttachments, const deUint32* attachments)
{
	// \todo [2012-07-17 pyry] Support multiple color attachments.
	rr::MultisampleConstPixelBufferAccess	colorBuf0	= getDrawColorbuffer();
	rr::MultisampleConstPixelBufferAccess	depthBuf	= getDrawDepthbuffer();
	rr::MultisampleConstPixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
	int										width		= 0;
	int										height		= 0;

	width = de::max(width, colorBuf0.raw().getHeight());
	width = de::max(width, depthBuf.raw().getHeight());
	width = de::max(width, stencilBuf.raw().getHeight());

	height = de::max(height, colorBuf0.raw().getDepth());
	height = de::max(height, depthBuf.raw().getDepth());
	height = de::max(height, stencilBuf.raw().getDepth());

	invalidateSubFramebuffer(target, numAttachments, attachments, 0, 0, width, height);
}